

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O2

void __thiscall duckdb::Linenoise::RefreshSingleLine(Linenoise *this)

{
  int fd;
  int iVar1;
  size_t pos;
  bool highlight;
  int plen;
  searchMatch *in_stack_ffffffffffffff38;
  size_t render_pos;
  size_t render_len;
  char *render_buf;
  AppendBuffer append_buffer;
  string highlight_buffer;
  char seq [64];
  
  plen = GetPromptWidth(this);
  fd = this->ofd;
  render_buf = this->buf;
  render_len = this->len;
  render_pos = 0;
  highlight_buffer._M_dataplus._M_p = (pointer)&highlight_buffer.field_2;
  highlight_buffer._M_string_length = 0;
  highlight_buffer.field_2._M_local_buf[0] = '\0';
  pos = this->pos;
  iVar1 = (this->ws).ws_col;
  highlight = Highlighting::IsEnabled();
  renderText(&render_pos,&render_buf,&render_len,pos,(long)iVar1,(long)plen,&highlight_buffer,
             highlight,in_stack_ffffffffffffff38);
  append_buffer.buffer._M_dataplus._M_p = (pointer)&append_buffer.buffer.field_2;
  append_buffer.buffer._M_string_length = 0;
  append_buffer.buffer.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::append((char *)&append_buffer);
  ::std::__cxx11::string::append((char *)&append_buffer);
  ::std::__cxx11::string::append((char *)&append_buffer,(ulong)render_buf);
  RefreshShowHints(this,&append_buffer,plen);
  ::std::__cxx11::string::append((char *)&append_buffer);
  snprintf(seq,0x40,"\r\x1b[%dC",(ulong)(uint)(plen + (int)render_pos));
  ::std::__cxx11::string::append((char *)&append_buffer);
  AppendBuffer::Write(&append_buffer,fd);
  ::std::__cxx11::string::~string((string *)&append_buffer);
  ::std::__cxx11::string::~string((string *)&highlight_buffer);
  return;
}

Assistant:

void Linenoise::RefreshSingleLine() const {
	char seq[64];
	size_t plen = GetPromptWidth();
	int fd = ofd;
	char *render_buf = buf;
	size_t render_len = len;
	size_t render_pos = 0;
	std::string highlight_buffer;

	renderText(render_pos, render_buf, render_len, pos, ws.ws_col, plen, highlight_buffer, Highlighting::IsEnabled());

	AppendBuffer append_buffer;
	/* Cursor to left edge */
	append_buffer.Append("\r");
	/* Write the prompt and the current buffer content */
	append_buffer.Append(prompt);
	append_buffer.Append(render_buf, render_len);
	/* Show hits if any. */
	RefreshShowHints(append_buffer, plen);
	/* Erase to right */
	append_buffer.Append("\x1b[0K");
	/* Move cursor to original position. */
	snprintf(seq, 64, "\r\x1b[%dC", (int)(render_pos + plen));
	append_buffer.Append(seq);
	append_buffer.Write(fd);
}